

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::HttpInputStream::Message> * __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Message>::operator=
          (ExceptionOr<kj::HttpInputStream::Message> *this,
          ExceptionOr<kj::HttpInputStream::Message> *param_1)

{
  NullableValue<kj::Exception>::operator=
            ((NullableValue<kj::Exception> *)this,(NullableValue<kj::Exception> *)param_1);
  NullableValue<kj::HttpInputStream::Message>::operator=(&(this->value).ptr,&(param_1->value).ptr);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;